

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsidebar.cpp
# Opt level: O0

void __thiscall QUrlModel::setFileSystemModel(QUrlModel *this,QFileSystemModel *model)

{
  long lVar1;
  long in_RSI;
  array<QMetaObject::Connection,_3UL> *in_RDI;
  long in_FS_OFFSET;
  value_type *conn;
  const_iterator __end2;
  const_iterator __begin2;
  add_const_t<std::array<QMetaObject::Connection,_3UL>_> *__range2;
  code *pcVar2;
  offset_in_QUrlModel_to_subr *slot;
  ContextType *in_stack_ffffffffffffff68;
  ContextType *in_stack_ffffffffffffff70;
  ContextType *local_88;
  array<QMetaObject::Connection,_3UL> *signal;
  undefined1 local_68 [24];
  ConnectionType type;
  undefined8 in_stack_ffffffffffffffb0;
  
  type = (ConnectionType)in_stack_ffffffffffffffb0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != *(long *)(in_RDI + 1)) {
    signal = in_RDI;
    if (*(long *)(in_RDI + 1) != 0) {
      local_88 = (ContextType *)
                 std::array<QMetaObject::Connection,_3UL>::begin
                           ((array<QMetaObject::Connection,_3UL> *)0x785de3);
      in_stack_ffffffffffffff70 =
           (ContextType *)
           std::array<QMetaObject::Connection,_3UL>::end
                     ((array<QMetaObject::Connection,_3UL> *)0x785df2);
      for (; type = (ConnectionType)in_stack_ffffffffffffffb0, local_88 != in_stack_ffffffffffffff70
          ; local_88 = (ContextType *)&local_88->field_0x8) {
        in_stack_ffffffffffffff68 = local_88;
        QObject::disconnect((Connection *)local_88);
      }
    }
    *(long *)(in_RDI + 1) = in_RSI;
    if (*(long *)(in_RDI + 1) != 0) {
      slot = (offset_in_QUrlModel_to_subr *)0x0;
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,QModelIndex_const&,QList<int>const&),void(QUrlModel::*)(QModelIndex_const&,QModelIndex_const&)>
                ((Object *)in_stack_ffffffffffffff70,(offset_in_QAbstractItemModel_to_subr)signal,
                 in_stack_ffffffffffffff68,(offset_in_QUrlModel_to_subr *)0x0,type);
      pcVar2 = layoutChanged;
      QObject::
      connect<void(QAbstractItemModel::*)(QList<QPersistentModelIndex>const&,QAbstractItemModel::LayoutChangeHint),void(QUrlModel::*)()>
                ((Object *)in_stack_ffffffffffffff70,(offset_in_QAbstractItemModel_to_subr)signal,
                 in_stack_ffffffffffffff68,slot,type);
      QObject::
      connect<void(QAbstractItemModel::*)(QModelIndex_const&,int,int,QAbstractItemModel::QPrivateSignal),void(QUrlModel::*)()>
                ((Object *)in_stack_ffffffffffffff70,(offset_in_QAbstractItemModel_to_subr)signal,
                 in_stack_ffffffffffffff68,slot,(ConnectionType)pcVar2);
      std::array<QMetaObject::Connection,_3UL>::operator=
                (in_RDI,(array<QMetaObject::Connection,_3UL> *)pcVar2);
      std::array<QMetaObject::Connection,_3UL>::~array(in_RDI);
    }
    QStandardItemModel::clear();
    QModelIndex::QModelIndex((QModelIndex *)0x785fb4);
    (**(code **)(*(long *)in_RDI + 0x100))(in_RDI,0,1,local_68);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QUrlModel::setFileSystemModel(QFileSystemModel *model)
{
    if (model == fileSystemModel)
        return;
    if (fileSystemModel != nullptr) {
        for (const auto &conn : std::as_const(modelConnections))
            disconnect(conn);
    }
    fileSystemModel = model;
    if (fileSystemModel != nullptr) {
        modelConnections = {
            connect(model, &QFileSystemModel::dataChanged,
                    this, &QUrlModel::dataChanged),
            connect(model, &QFileSystemModel::layoutChanged,
                    this, &QUrlModel::layoutChanged),
            connect(model, &QFileSystemModel::rowsRemoved,
                    this, &QUrlModel::layoutChanged),
        };
    }
    clear();
    insertColumns(0, 1);
}